

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Exception.cpp
# Opt level: O3

void __thiscall Exception::Exception(Exception *this,char *err_msg_par,char c_par)

{
  size_t sVar1;
  char *__dest;
  
  *(undefined ***)this = &PTR__Exception_0011ad78;
  (this->err_word)._M_dataplus._M_p = (pointer)&(this->err_word).field_2;
  (this->err_word)._M_string_length = 0;
  (this->err_word).field_2._M_local_buf[0] = '\0';
  sVar1 = strlen(err_msg_par);
  __dest = (char *)operator_new__(sVar1 + 1);
  this->err_msg = __dest;
  strcpy(__dest,err_msg_par);
  std::__cxx11::string::push_back((char)this + '\x10');
  return;
}

Assistant:

Exception::Exception(const char *err_msg_par, const char c_par) {
    err_msg = new char[strlen(err_msg_par) + 1];
    strcpy(err_msg, err_msg_par);
    err_word += c_par;
}